

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::TextureSizeCase::testTextureSize(TextureSizeCase *this,TestSize *testSize)

{
  int *piVar1;
  ostringstream *poVar2;
  TextureType TVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *context;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  OutOfMemoryError *this_00;
  byte bVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  GLuint texId;
  IVec3 expectedSize;
  Vec4 triangle [3];
  undefined4 local_240;
  undefined4 local_224;
  undefined1 local_220 [16];
  TextureLevel local_210;
  undefined1 local_1e8 [120];
  ios_base local_170 [264];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long lVar11;
  
  local_68 = 0xbf800000bf800000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0xbf80000040800000;
  uStack_50 = 0x3f80000000000000;
  local_48 = 0xbf800000;
  uStack_44 = 0x40800000;
  uStack_40 = 0;
  uStack_3c = 0x3f800000;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar6);
  uVar7 = (**(code **)(lVar11 + 0x780))((this->m_program->m_program).m_program,"a_position");
  uVar8 = (**(code **)(lVar11 + 0xb48))((this->m_program->m_program).m_program,"u_sampler");
  uVar9 = (**(code **)(lVar11 + 0xb48))((this->m_program->m_program).m_program,"u_texSize");
  uVar10 = (**(code **)(lVar11 + 0xb48))((this->m_program->m_program).m_program,"u_lod");
  TVar3 = (this->m_textureSpec).type;
  uVar15 = (ulong)TVar3;
  local_240 = 0;
  if (uVar15 < 4) {
    local_240 = *(undefined4 *)(&DAT_01c3b040 + uVar15 * 4);
  }
  iVar6 = (testSize->textureSize).m_data[0];
  iVar4 = (testSize->textureSize).m_data[1];
  bVar12 = (char)testSize->lodBase + (char)testSize->lod;
  iVar13 = iVar6 >> (bVar12 & 0x1f);
  iVar14 = iVar4 >> (bVar12 & 0x1f);
  if (uVar15 == 1 && iVar6 != iVar4) {
    return true;
  }
  if (TVar3 == TEXTURETYPE_2D && (iVar14 == 0 && iVar13 == 0)) {
    return true;
  }
  if (TVar3 == TEXTURETYPE_2D_ARRAY && (iVar14 == 0 && iVar13 == 0)) {
    return true;
  }
  piVar1 = &testSize->lod;
  (**(code **)(lVar11 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar11 + 0x14f0))(uVar8,0);
  (**(code **)(lVar11 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  (**(code **)(lVar11 + 0x1a00))(0,0,1,1);
  (**(code **)(lVar11 + 0x19f0))(uVar7,4,0x1406,0,0,&local_68);
  (**(code **)(lVar11 + 0x610))(uVar7);
  iVar6 = testSize->lod + testSize->lodBase + 1;
  local_224 = 0;
  (**(code **)(lVar11 + 0x6f8))(1,&local_224);
  (**(code **)(lVar11 + 0xb8))(local_240,local_224);
  (**(code **)(lVar11 + 0x1360))(local_240,0x2801,0x2600);
  (**(code **)(lVar11 + 0x1360))(local_240,0x2800,0x2600);
  (**(code **)(lVar11 + 0x1360))(local_240,0x813c,testSize->lodBase);
  TVar3 = (this->m_textureSpec).type;
  if (TVar3 < TEXTURETYPE_2D_ARRAY) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Testing image size ",0x13)
    ;
    std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
    std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_170);
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Lod: ",5);
    std::ostream::operator<<(poVar2,*piVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", base level: ",0xe);
    std::ostream::operator<<(poVar2,testSize->lodBase);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_170);
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Expecting: ",0xb);
    std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
    std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_170);
    (**(code **)(lVar11 + 0x1538))(uVar9,1,&testSize->expectedSize);
    (**(code **)(lVar11 + 0x14f8))(uVar10,1,piVar1);
    (**(code **)(lVar11 + 0x1380))
              (local_240,iVar6,(this->m_textureSpec).format,(testSize->textureSize).m_data[0],
               (testSize->textureSize).m_data[1]);
  }
  else {
    if (TVar3 == TEXTURETYPE_2D_ARRAY) {
      local_210.m_format.order = (testSize->expectedSize).m_data[0];
      local_210.m_format.type = (testSize->expectedSize).m_data[1];
      local_210.m_size.m_data[0] = (testSize->textureSize).m_data[2];
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Testing image size ",0x13);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," with ",6);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," layer(s)",9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_170);
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Lod: ",5);
      std::ostream::operator<<(poVar2,*piVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", base level: ",0xe);
      std::ostream::operator<<(poVar2,testSize->lodBase);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_170);
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Expecting: ",0xb);
      std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
      std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," and ",5);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," layer(s)",9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_170);
      (**(code **)(lVar11 + 0x1578))(uVar9,1,&local_210);
      (**(code **)(lVar11 + 0x14f8))(uVar10,1,piVar1);
      dVar5 = (this->m_textureSpec).format;
      iVar4 = (testSize->textureSize).m_data[0];
      iVar13 = (testSize->textureSize).m_data[1];
      iVar14 = (testSize->textureSize).m_data[2];
    }
    else {
      if (TVar3 != TEXTURETYPE_3D) goto LAB_01128864;
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Testing image size ",0x13);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
      std::ostream::operator<<(poVar2,(testSize->textureSize).m_data[2]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_170);
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Lod: ",5);
      std::ostream::operator<<(poVar2,*piVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", base level: ",0xe);
      std::ostream::operator<<(poVar2,testSize->lodBase);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_170);
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Expecting: ",0xb);
      std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
      std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
      std::ostream::operator<<(poVar2,(testSize->expectedSize).m_data[2]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_170);
      (**(code **)(lVar11 + 0x1578))(uVar9,1,&testSize->expectedSize);
      (**(code **)(lVar11 + 0x14f8))(uVar10,1,piVar1);
      dVar5 = (this->m_textureSpec).format;
      iVar4 = (testSize->textureSize).m_data[0];
      iVar13 = (testSize->textureSize).m_data[1];
      iVar14 = (testSize->textureSize).m_data[2];
    }
    (**(code **)(lVar11 + 0x1398))(local_240,iVar6,dVar5,iVar4,iVar13,iVar14);
  }
LAB_01128864:
  iVar6 = (**(code **)(lVar11 + 0x800))();
  if (iVar6 == 0) {
    local_1e8._0_4_ = RGBA;
    local_1e8._4_4_ = UNORM_INT8;
    tcu::TextureLevel::TextureLevel(&local_210,(TextureFormat *)local_1e8,1,1,1);
    (**(code **)(lVar11 + 0x188))(0x4000);
    (**(code **)(lVar11 + 0x538))(4,0,3);
    (**(code **)(lVar11 + 0x648))();
    context = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1e8,&local_210);
    glu::readPixels(context,0,0,(PixelBufferAccess *)local_1e8);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1e8,&local_210);
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_220,(int)local_1e8,0,0);
    bVar16 = (bool)(0.9 <= (float)local_220._8_4_ &
                   -(0.9 <= (float)local_220._4_4_) & -(0.9 <= (float)local_220._0_4_));
    if (bVar16 == true) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1e8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e8 + 8),"Passed",6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1e8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e8 + 8),"Failed",6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_170);
    tcu::TextureLevel::~TextureLevel(&local_210);
  }
  else {
    if (iVar6 == 0x505) {
      this_00 = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
      glu::OutOfMemoryError::OutOfMemoryError
                (this_00,"Failed to allocate texture, got GL_OUT_OF_MEMORY.","TexStorageXD",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderTextureFunctionTests.cpp"
                 ,0x4be);
      __cxa_throw(this_00,&glu::OutOfMemoryError::typeinfo,glu::OutOfMemoryError::~OutOfMemoryError)
      ;
    }
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed, got ",0xc);
    local_210.m_format = (TextureFormat)glu::getErrorName;
    local_210.m_size.m_data[0] = iVar6;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_210,(ostream *)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_170);
    bVar16 = false;
  }
  local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1e8 + 8));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e8 + 8));
  std::ios_base::~ios_base(local_170);
  (**(code **)(lVar11 + 0xb8))(local_240,0);
  (**(code **)(lVar11 + 0x480))(1,&local_224);
  (**(code **)(lVar11 + 0x1680))(0);
  return bVar16;
}

Assistant:

bool TextureSizeCase::testTextureSize (const TestSize& testSize)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[3] = // covers entire viewport
	{
		tcu::Vec4(-1, -1, 0, 1),
		tcu::Vec4( 4, -1, 0, 1),
		tcu::Vec4(-1,  4, 0, 1),
	};

	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	const glw::GLint		positionLoc		= gl.getAttribLocation	(m_program->getProgram(), "a_position");
	const glw::GLint		samplerLoc		= gl.getUniformLocation	(m_program->getProgram(), "u_sampler");
	const glw::GLint		sizeLoc			= gl.getUniformLocation	(m_program->getProgram(), "u_texSize");
	const glw::GLint		lodLoc			= gl.getUniformLocation	(m_program->getProgram(), "u_lod");
	const glw::GLenum		textureTarget	= getGLTextureTarget	();
	const bool				isSquare		= testSize.textureSize.x() == testSize.textureSize.y();
	const bool				is2DLodValid	= (testSize.textureSize.x() >> (testSize.lod + testSize.lodBase)) != 0 || (testSize.textureSize.y() >> (testSize.lod + testSize.lodBase)) != 0;
	bool					success			= true;
	glw::GLenum				errorValue;

	// Skip incompatible cases
	if (m_textureSpec.type == TEXTURETYPE_CUBE_MAP && !isSquare)
		return true;
	if (m_textureSpec.type == TEXTURETYPE_2D && !is2DLodValid)
		return true;
	if (m_textureSpec.type == TEXTURETYPE_2D_ARRAY && !is2DLodValid)
		return true;

	// setup rendering

	gl.useProgram				(m_program->getProgram());
	gl.uniform1i				(samplerLoc, 0);
	gl.clearColor				(0.5f, 0.5f, 0.5f, 1.0f);
	gl.viewport					(0, 0, 1, 1);
	gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);
	gl.enableVertexAttribArray	(positionLoc);

	// setup texture
	{
		const int	maxLevel	= testSize.lod + testSize.lodBase;
		const int	levels		= maxLevel + 1;
		glw::GLuint texId		= 0;

		// gen texture
		gl.genTextures(1, &texId);
		gl.bindTexture(textureTarget, texId);
		gl.texParameteri(textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(textureTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(textureTarget, GL_TEXTURE_BASE_LEVEL, testSize.lodBase);

		// set up texture

		switch (m_textureSpec.type)
		{
			case TEXTURETYPE_3D:
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << "x" << testSize.textureSize.z() << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << "x" << testSize.expectedSize.z() << TestLog::EndMessage;

				gl.uniform3iv(sizeLoc, 1, testSize.expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage3D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y(), testSize.textureSize.z());
				break;
			}

			case TEXTURETYPE_2D:
			case TEXTURETYPE_CUBE_MAP:
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << TestLog::EndMessage;

				gl.uniform2iv(sizeLoc, 1, testSize.expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage2D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y());
				break;
			}

			case TEXTURETYPE_2D_ARRAY:
			{
				tcu::IVec3 expectedSize(testSize.expectedSize.x(), testSize.expectedSize.y(), testSize.textureSize.z());

				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << " with " << testSize.textureSize.z() << " layer(s)" << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << " and " << testSize.textureSize.z() << " layer(s)" << TestLog::EndMessage;

				gl.uniform3iv(sizeLoc, 1, expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage3D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y(), testSize.textureSize.z());
				break;
			}

			default:
			{
				DE_ASSERT(false);
				break;
			}
		}

		errorValue = gl.getError();
		if (errorValue == GL_OUT_OF_MEMORY)
		{
			throw glu::OutOfMemoryError("Failed to allocate texture, got GL_OUT_OF_MEMORY.", "TexStorageXD", __FILE__, __LINE__);
		}
		else if (errorValue != GL_NO_ERROR)
		{
			// error is a failure too
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failed, got " << glu::getErrorStr(errorValue) << "." << tcu::TestLog::EndMessage;
			success = false;
		}
		else
		{
			// test
			const float			colorTolerance = 0.1f;
			tcu::TextureLevel	sample			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
			tcu::Vec4			outputColor;

			gl.clear			(GL_COLOR_BUFFER_BIT);
			gl.drawArrays		(GL_TRIANGLES, 0, 3);
			gl.finish			();

			glu::readPixels		(m_context.getRenderContext(), 0, 0, sample.getAccess());

			outputColor = sample.getAccess().getPixel(0, 0);

			if (outputColor.x() >= 1.0f - colorTolerance &&
				outputColor.y() >= 1.0f - colorTolerance &&
				outputColor.z() >= 1.0f - colorTolerance)
			{
				// success
				m_context.getTestContext().getLog() << TestLog::Message << "Passed" << TestLog::EndMessage;
			}
			else
			{
				// failure
				m_context.getTestContext().getLog() << TestLog::Message << "Failed" << TestLog::EndMessage;
				success = false;
			}
		}

		// empty line to format log nicely
		m_context.getTestContext().getLog() << TestLog::Message << TestLog::EndMessage;

		// free
		gl.bindTexture		(textureTarget, 0);
		gl.deleteTextures	(1, &texId);
	}

	gl.useProgram(0);

	return success;
}